

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write_scalar_plain
          (Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,csubstr s,size_t ilevel)

{
  size_t *psVar1;
  code *pcVar2;
  size_t sVar3;
  error_flags eVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  basic_substring<const_char> local_50;
  long local_40;
  size_t local_38;
  
  uVar5 = s.len;
  pcVar6 = s.str;
  if (uVar5 == 0) {
    uVar9 = 0;
  }
  else {
    local_40 = ilevel + 1;
    uVar7 = 0;
    uVar8 = 0;
    local_38 = ilevel;
    do {
      uVar9 = uVar8;
      if (pcVar6[uVar7] == '\n') {
        if (uVar5 < uVar8) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          handle_error(0x24a7ca,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1544,"first >= 0 && first <= len");
        }
        uVar9 = uVar7 + 1;
        uVar10 = uVar9;
        if (uVar9 == 0xffffffffffffffff) {
          uVar10 = uVar5;
        }
        if (uVar10 < uVar8) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          handle_error(0x24a7ca,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1546,"first <= last");
        }
        if (uVar5 < uVar10) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          handle_error(0x24a7ca,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1547,"last >= 0 && last <= len");
        }
        basic_substring<const_char>::basic_substring(&local_50,pcVar6 + uVar8,uVar10 - uVar8);
        sVar3 = local_50.len;
        if (local_50.str != (char *)0x0 && local_50.len != 0) {
          std::ostream::write((char *)(this->
                                      super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ).m_stream,(long)local_50.str);
          psVar1 = &(this->
                    super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).m_pos;
          *psVar1 = *psVar1 + sVar3;
        }
        bVar12 = local_38 != 0xffffffffffffffff;
        std::ostream::put((char)(this->
                                super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ).m_stream);
        psVar1 = &(this->
                  super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).m_pos;
        *psVar1 = *psVar1 + 1;
        lVar11 = local_40;
        if (uVar9 < uVar5 && bVar12) {
          do {
            std::ostream::put((char)(this->
                                    super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ).m_stream);
            psVar1 = &(this->
                      super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).m_pos;
            *psVar1 = *psVar1 + 1;
            std::ostream::put((char)(this->
                                    super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ).m_stream);
            psVar1 = &(this->
                      super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).m_pos;
            *psVar1 = *psVar1 + 1;
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
        }
      }
      uVar7 = uVar7 + 1;
      uVar8 = uVar9;
    } while (uVar7 != uVar5);
  }
  if ((uVar9 <= uVar5 && uVar5 - uVar9 != 0) &&
     (basic_substring<const_char>::basic_substring(&local_50,pcVar6 + uVar9,uVar5 - uVar9),
     local_50.str != (char *)0x0 && local_50.len != 0)) {
    std::ostream::write((char *)(this->
                                super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ).m_stream,(long)local_50.str);
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + local_50.len;
  }
  return;
}

Assistant:

void Emitter<Writer>::_write_scalar_plain(csubstr s, size_t ilevel)
{
    size_t pos = 0; // tracks the last character that was already written
    for(size_t i = 0; i < s.len; ++i)
    {
        const char curr = s.str[i];
        if(curr == '\n')
        {
            csubstr sub = s.range(pos, i+1);
            this->Writer::_do_write(sub);  // write everything up to (including) this newline
            this->Writer::_do_write('\n'); // write the newline again
            if(i + 1 < s.len)
                _rymlindent_nextline()     // indent the next line
            pos = i+1;
        }
    }
    // write missing characters at the end of the string
    if(pos < s.len)
    {
        csubstr sub = s.sub(pos);
        this->Writer::_do_write(sub);
    }
}